

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult __thiscall
testing::internal::CmpHelperEQ<char[26],std::__cxx11::string>
          (internal *this,char *expected_expression,char *actual_expression,char (*expected) [26],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  iVar1 = std::__cxx11::string::compare((char *)actual);
  if (iVar1 == 0) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    String::ShowCStringQuoted((String *)&local_48.field_2,*expected);
    FormatForComparisonFailureMessage<std::__cxx11::string,char[26]>
              (&local_48,(char (*) [26])actual);
    AVar3 = EqFailure(this,expected_expression,actual_expression,(String *)&local_48.field_2,
                      (String *)&local_48,false);
    sVar2 = AVar3.message_.ptr_;
    if (local_48._M_dataplus._M_p != (pointer)0x0) {
      operator_delete__(local_48._M_dataplus._M_p);
      sVar2.ptr_ = extraout_RDX;
    }
    if ((void *)local_48.field_2._M_allocated_capacity != (void *)0x0) {
      operator_delete__((void *)local_48.field_2._M_allocated_capacity);
      sVar2.ptr_ = extraout_RDX_00;
    }
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                               // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}